

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asin.c
# Opt level: O0

double c_asin(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  short local_3a;
  short sign;
  double zz;
  double z;
  double p;
  double a;
  double x_local;
  
  if (x <= 0.0) {
    local_3a = -1;
    p = -x;
  }
  else {
    local_3a = 1;
    p = x;
  }
  if (p <= 1.0) {
    if (p <= 0.625) {
      if (p < 1e-08) {
        return x;
      }
      dVar1 = p * p;
      dVar2 = polevl(dVar1,P,5);
      dVar3 = p1evl(dVar1,Q,5);
      zz = p * ((dVar1 * dVar2) / dVar3) + p;
    }
    else {
      dVar1 = 1.0 - p;
      dVar2 = polevl(dVar1,R,4);
      dVar3 = p1evl(dVar1,S,4);
      dVar4 = c_sqrt(dVar1 + dVar1);
      zz = ((PIO4 - dVar4) - (dVar4 * ((dVar1 * dVar2) / dVar3) - 6.123233995736766e-17)) + PIO4;
    }
    if (local_3a < 0) {
      zz = -zz;
    }
    x_local = zz;
  }
  else {
    mtherr("asin",1);
    x_local = NAN;
  }
  return x_local;
}

Assistant:

double c_asin(x)
double x;
{
double a, p, z, zz;
short sign;

if( x > 0 )
	{
	sign = 1;
	a = x;
	}
else
	{
	sign = -1;
	a = -x;
	}

if( a > 1.0 )
	{
	mtherr( "asin", DOMAIN );
	return( NAN );
	}

if( a > 0.625 )
	{
	/* arcsin(1-x) = pi/2 - sqrt(2x)(1+R(x))  */
	zz = 1.0 - a;
	p = zz * polevl( zz, R, 4)/p1evl( zz, S, 4);
	zz = c_sqrt(zz+zz);
	z = PIO4 - zz;
	zz = zz * p - MOREBITS;
	z = z - zz;
	z = z + PIO4;
	}
else
	{
	if( a < 1.0e-8 )
		{
		return(x);
		}
	zz = a * a;
	z = zz * polevl( zz, P, 5)/p1evl( zz, Q, 5);
	z = a * z + a;
	}
if( sign < 0 )
	z = -z;
return(z);
}